

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

StringResultCode
QCborStreamReaderPrivate::appendStringChunk(QCborStreamReader *reader,QByteArray *data)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  long lVar6;
  QCborStreamReaderPrivate *pQVar7;
  ulong uVar8;
  ReadStringChunk params;
  StringResult<long_long> SVar9;
  
  params.maxlen_or_type = -1;
  params.field_0.array = data;
  SVar9 = readStringChunk((reader->d)._M_t.
                          super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
                          .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl,
                          params);
  if ((SVar9.status == EndOfString) &&
     (pQVar7 = (reader->d)._M_t.
               super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
               .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl,
     (pQVar7->lastError).c == NoError)) {
    uVar1 = (pQVar7->currentElement).type;
    reader->type_ = uVar1;
    if (uVar1 == 0xff) {
      if ((pQVar7->device != (QIODevice *)0x0) &&
         (*(qsizetype *)((long)&(pQVar7->containerStack).super_QList<CborValue> + 0x10) == 0)) {
        QByteArray::clear(&pQVar7->buffer);
        pQVar7 = (reader->d)._M_t.
                 super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
                 .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl;
        if (pQVar7->bufferStart != 0) {
          QIODevice::skip(pQVar7->device,pQVar7->bufferStart);
          pQVar7 = (reader->d)._M_t.
                   super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
                   .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl;
        }
        pQVar7->bufferStart = 0;
      }
    }
    else {
      (pQVar7->lastError).c = NoError;
      if ((byte)(uVar1 + 0xb) < 3) {
        reader->type_ = 0xe0;
        reader->value64 =
             (ulong)(byte)(*(char **)((long)&(pQVar7->buffer).d + 8))[pQVar7->bufferStart] - 0xe0;
      }
      else {
        bVar2 = (pQVar7->currentElement).flags;
        if ((bVar2 & 2) == 0) {
          uVar8 = (ulong)(pQVar7->currentElement).extra;
        }
        else {
          puVar4 = (pQVar7->currentElement).source.ptr;
          lVar5 = *(long *)(puVar4 + 0x10);
          lVar6 = *(long *)(puVar4 + 0x68);
          if ((bVar2 & 1) == 0) {
            uVar3 = *(uint *)(lVar5 + 1 + lVar6);
            uVar8 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18);
          }
          else {
            uVar8 = *(ulong *)(lVar5 + 1 + lVar6);
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
          }
        }
        reader->value64 = uVar8;
        if ((bVar2 & 4) != 0 && uVar1 == '\0') {
          reader->type_ = ' ';
        }
      }
    }
  }
  return SVar9.status;
}

Assistant:

inline QCborStreamReader::StringResultCode
QCborStreamReaderPrivate::appendStringChunk(QCborStreamReader &reader, QByteArray *data)
{
    auto status = reader.d->readStringChunk(data).status;
    if (status == QCborStreamReader::EndOfString && reader.lastError() == QCborError::NoError)
        reader.preparse();
    return status;
}